

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall sglr::ReferenceContext::bindVertexArray(ReferenceContext *this,deUint32 array)

{
  VertexArray *local_20;
  VertexArray *vertexArrayObject;
  deUint32 array_local;
  ReferenceContext *this_local;
  
  local_20 = (VertexArray *)0x0;
  if ((array != 0) &&
     (local_20 = rc::ObjectManager<sglr::rc::VertexArray>::find(&this->m_vertexArrays,array),
     local_20 == (VertexArray *)0x0)) {
    local_20 = (VertexArray *)operator_new(0x30);
    rc::VertexArray::VertexArray(local_20,array,(this->m_limits).maxVertexAttribs);
    rc::ObjectManager<sglr::rc::VertexArray>::insert(&this->m_vertexArrays,local_20);
  }
  if (local_20 != (VertexArray *)0x0) {
    rc::ObjectManager<sglr::rc::VertexArray>::acquireReference(&this->m_vertexArrays,local_20);
  }
  if (this->m_vertexArrayBinding != (VertexArray *)0x0) {
    rc::ObjectManager<sglr::rc::VertexArray>::releaseReference
              (&this->m_vertexArrays,this->m_vertexArrayBinding);
  }
  this->m_vertexArrayBinding = local_20;
  return;
}

Assistant:

void ReferenceContext::bindVertexArray (deUint32 array)
{
	rc::VertexArray* vertexArrayObject = DE_NULL;

	if (array != 0)
	{
		vertexArrayObject = m_vertexArrays.find(array);
		if (!vertexArrayObject)
		{
			vertexArrayObject = new rc::VertexArray(array, m_limits.maxVertexAttribs);
			m_vertexArrays.insert(vertexArrayObject);
		}
	}

	// Create new references
	if (vertexArrayObject)
		m_vertexArrays.acquireReference(vertexArrayObject);

	// Remove old references
	if (m_vertexArrayBinding)
		m_vertexArrays.releaseReference(m_vertexArrayBinding);

	m_vertexArrayBinding = vertexArrayObject;
}